

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  LogMessage *pLVar6;
  char *pcVar7;
  char *pcVar8;
  size_t __n;
  void *data;
  uint32_t tag;
  char *ptr;
  
  pcVar7 = this->next_chunk_;
  if (pcVar7 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = this->buffer_;
    if (pcVar7 != pcVar8) {
      iVar4 = this->size_;
      if (iVar4 < 0x11) {
        LogMessage::LogMessage
                  ((LogMessage *)&ptr,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0x69);
        pLVar6 = LogMessage::operator<<((LogMessage *)&ptr,"CHECK failed: size_ > kSlopBytes: ");
        LogFinisher::operator=((LogFinisher *)&data,pLVar6);
        LogMessage::~LogMessage((LogMessage *)&ptr);
        pcVar7 = this->next_chunk_;
        iVar4 = this->size_;
      }
      this->buffer_end_ = pcVar7 + (long)iVar4 + -0x10;
      this->next_chunk_ = pcVar8;
      if (this->aliasing_ != 1) {
        return pcVar7;
      }
      this->aliasing_ = 2;
      return pcVar7;
    }
    uVar2 = *(undefined8 *)(this->buffer_end_ + 8);
    *(undefined8 *)pcVar8 = *(undefined8 *)this->buffer_end_;
    *(undefined8 *)(this->buffer_ + 8) = uVar2;
    if (0 < this->overall_limit_) {
      if (-1 < depth) {
        if (overrun < 0) {
          LogMessage::LogMessage
                    ((LogMessage *)&ptr,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                     ,0x35);
          pLVar6 = LogMessage::operator<<((LogMessage *)&ptr,"CHECK failed: overrun >= 0: ");
          LogFinisher::operator=((LogFinisher *)&data,pLVar6);
        }
        else {
          if ((uint)overrun < 0x11) goto LAB_002c06f5;
          LogMessage::LogMessage
                    ((LogMessage *)&ptr,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                     ,0x36);
          pLVar6 = LogMessage::operator<<
                             ((LogMessage *)&ptr,"CHECK failed: overrun <= kSlopBytes: ");
          LogFinisher::operator=((LogFinisher *)&data,pLVar6);
        }
        LogMessage::~LogMessage((LogMessage *)&ptr);
LAB_002c06f5:
        ptr = pcVar8 + overrun;
        pcVar1 = this->buffer_ + 0x10;
LAB_002c070e:
        if (((pcVar1 <= ptr) || (ptr = ReadTag(ptr,&tag,0), ptr == (char *)0x0)) || (pcVar1 < ptr))
        goto switchD_002c0758_default;
        if (tag == 0) goto LAB_002c0845;
        switch(tag & 7) {
        case 0:
          goto switchD_002c0758_caseD_0;
        case 1:
          ptr = ptr + 8;
          goto LAB_002c070e;
        case 2:
          uVar5 = ReadSize(&ptr);
          if ((ptr == (char *)0x0) || ((long)pcVar1 - (long)ptr < (long)(int)uVar5)) break;
          ptr = ptr + (int)uVar5;
          goto LAB_002c070e;
        case 3:
          depth = depth + 1;
          goto LAB_002c070e;
        case 4:
          if (depth < 1) goto LAB_002c0845;
          depth = depth + -1;
          goto LAB_002c070e;
        case 5:
          ptr = ptr + 4;
          goto LAB_002c070e;
        default:
          break;
        }
      }
switchD_002c0758_default:
      while (bVar3 = StreamNext(this,&data), bVar3) {
        iVar4 = this->size_;
        __n = (size_t)iVar4;
        if (0x10 < (long)__n) {
          uVar2 = *(undefined8 *)((long)data + 8);
          *(undefined8 *)(this->buffer_ + 0x10) = *data;
          *(undefined8 *)(this->buffer_ + 0x18) = uVar2;
          this->next_chunk_ = (char *)data;
          this->buffer_end_ = this->buffer_ + 0x10;
LAB_002c08a0:
          if (this->aliasing_ < 2) {
            return pcVar8;
          }
          this->aliasing_ = 1;
          return pcVar8;
        }
        if (0 < iVar4) {
          memcpy(this->buffer_ + 0x10,data,__n);
          this->next_chunk_ = pcVar8;
          this->buffer_end_ = pcVar8 + __n;
          goto LAB_002c08a0;
        }
        if (iVar4 != 0) {
          LogMessage::LogMessage
                    ((LogMessage *)&ptr,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                     ,0x89);
          pLVar6 = LogMessage::operator<<((LogMessage *)&ptr,"CHECK failed: size_ == 0: ");
          pLVar6 = LogMessage::operator<<(pLVar6,this->size_);
          LogFinisher::operator=((LogFinisher *)&tag,pLVar6);
          LogMessage::~LogMessage((LogMessage *)&ptr);
        }
      }
      this->overall_limit_ = 0;
    }
LAB_002c0845:
    if (this->aliasing_ == 2) {
      this->aliasing_ = (long)this->buffer_end_ - (long)pcVar7;
    }
    this->next_chunk_ = (char *)0x0;
    this->buffer_end_ = this->buffer_ + 0x10;
    this->size_ = 0;
  }
  return pcVar8;
switchD_002c0758_caseD_0:
  ptr = VarintParse<unsigned_long>(ptr,(unsigned_long *)&data);
  if (ptr == (char *)0x0) goto switchD_002c0758_default;
  goto LAB_002c070e;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion(buffer_, overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}